

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_shaders.cpp
# Opt level: O2

void gen_WARD_anisotropic_phong_shade
               (float *cl,float *cp,float *l,float *e,float *n,float pu,float pv,float y,
               float *clambert)

{
  float fVar1;
  float fVar2;
  float fVar3;
  vec3 kspec;
  vec3 y_v;
  vec3 v;
  vec3 h;
  undefined8 local_70;
  float local_68;
  float local_60 [3];
  float local_54;
  float local_50;
  undefined4 local_4c;
  float local_48 [3];
  float local_3c [3];
  
  vec3_add(local_3c,e,l);
  vec3_norm(local_3c,local_3c);
  local_54 = 0.0;
  local_4c = 0;
  local_50 = y;
  fVar1 = vec3_mul_inner(n,&local_54);
  vec3_scale(local_48,n,fVar1);
  vec3_sub(local_48,&local_54,local_48);
  vec3_norm(local_48,local_48);
  fVar1 = (float)*(undefined8 *)(n + 1);
  fVar2 = (float)((ulong)*(undefined8 *)(n + 1) >> 0x20);
  local_70 = CONCAT44(*n * SUB84(local_48._4_8_,4) - local_48[0] * fVar2,
                      fVar2 * (float)local_48._4_8_ - SUB84(local_48._4_8_,4) * fVar1);
  local_68 = local_48[0] * fVar1 - *n * (float)local_48._4_8_;
  vec3_norm((float *)&local_70,(float *)&local_70);
  fVar1 = vec3_mul_inner(n,l);
  fVar2 = vec3_mul_inner(n,e);
  fVar2 = fVar2 * (fVar1 / fVar1);
  if (fVar2 <= 0.0) {
    fVar2 = 0.0;
  }
  vec3_scale(local_60,cp,SQRT(fVar2));
  vec3_scale(local_60,local_60,1.0 / (pu * 12.566371 * pv));
  fVar1 = vec3_mul_inner(local_3c,(float *)&local_70);
  fVar1 = sqr(fVar1 / pu);
  fVar2 = vec3_mul_inner(local_3c,local_48);
  fVar2 = sqr(fVar2 / pv);
  fVar3 = vec3_mul_inner(local_3c,n);
  fVar1 = expf(((fVar2 + fVar1) * -2.0) / (fVar3 + 1.0));
  vec3_scale(local_60,local_60,fVar1);
  vec3_fraction(local_60,local_60,cl);
  vec3_add(clambert,clambert,local_60);
  vec3_cull(clambert);
  return;
}

Assistant:

void gen_WARD_anisotropic_phong_shade(const vec3 cl, const vec3 cp, const vec3 l, const vec3 e, const vec3 n, const float pu, const float pv, const float y, vec3 clambert){
    //calculate h
    vec3 h;
    vec3_add(h, e, l);
    vec3_norm(h,h);

    //calculate u and v unit vector
    vec3 v;
    vec3 y_v = {0.0f, y, 0.0f};
    vec3_scale(v, n, vec3_mul_inner(n,y_v));
    vec3_sub(v, y_v, v);
    vec3_norm(v,v);
    vec3 u;
    vec3_mul_cross(u, v, n);
    vec3_norm(u,u);
    
    //calculate kspecular
    vec3 kspec;
    vec3_scale(kspec, cp, sqrt( std::max(0.0f, vec3_mul_inner(n,l) / vec3_mul_inner(n,l)*vec3_mul_inner(n,e)) )); //first term of the multiplication
    vec3_scale(kspec, kspec, 1.0f / (4.0f*PI*pu*pv) ); //second term
    vec3_scale(kspec, kspec, exp( -2.0f * (sqr(vec3_mul_inner(h,u)/pu) + sqr(vec3_mul_inner(h,v)/pv)) / (1.0f+vec3_mul_inner(h,n)) ) ); //thrid term
    vec3_fraction(kspec, kspec, cl); //control one more time by light color

    //add specular to lambertian shade
    vec3_add(clambert, clambert, kspec);
    vec3_cull(clambert);
}